

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>
               (rc_data *begin,rc_data *end,random_engine *rng)

{
  difference_type dVar1;
  random_engine *rng_local;
  rc_data *end_local;
  rc_data *begin_local;
  
  dVar1 = std::
          distance<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>
                    (begin,end);
  if (1 < dVar1) {
    std::
    sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
              (begin,end);
    random_shuffle_unique<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>
              (begin,end,rng);
  }
  return;
}

Assistant:

inline void
calculator_sort(Iterator begin, Iterator end, random_engine& rng)
{
    if (std::distance(begin, end) > 1) {
        std::sort(begin, end, [](const auto& lhs, const auto& rhs) {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return lhs.value < rhs.value;
            else
                return rhs.value < lhs.value;
        });

        random_shuffle_unique(begin, end, rng);
    }
}